

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O0

void __thiscall
MinTopologicalSortTest_EmptyMinSort_Test::TestBody(MinTopologicalSortTest_EmptyMinSort_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_98;
  Message local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_29;
  undefined1 local_28 [8];
  Graph_conflict graph;
  MinTopologicalSortTest_EmptyMinSort_Test *this_local;
  
  graph.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator(&local_29);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_28,0,&local_29);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator(&local_29);
  ::wasm::TopologicalSort::minSort<std::less<unsigned_int>>(&local_68,(TopologicalSort *)local_28);
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88);
  testing::internal::EqHelper::
  Compare<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_nullptr>
            ((EqHelper *)local_50,"TopologicalSort::minSort<>(graph)","std::vector<Index>{}",
             &local_68,&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x73,message);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_28);
  return;
}

Assistant:

TEST(MinTopologicalSortTest, EmptyMinSort) {
  Graph graph(0);
  EXPECT_EQ(TopologicalSort::minSort<>(graph), std::vector<Index>{});
}